

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTInflateMap.cpp
# Opt level: O0

void __thiscall
TTD::TTDComparePath::WritePathToConsole
          (TTDComparePath *this,ThreadContext *threadContext,bool printNewline,char16 *namebuff,
          charcount_t namebuffLength)

{
  char16 *pcVar1;
  charcount_t cVar2;
  ulong uVar3;
  char16 *src;
  uint *puVar4;
  char16_t *pcVar5;
  bool bVar6;
  charcount_t local_40;
  uint uStack_3c;
  bool isFirst;
  PropertyRecord *local_38;
  PropertyRecord *pRecord;
  char16 *pcStack_28;
  charcount_t namebuffLength_local;
  char16 *namebuff_local;
  ThreadContext *pTStack_18;
  bool printNewline_local;
  ThreadContext *threadContext_local;
  TTDComparePath *this_local;
  
  pRecord._4_4_ = namebuffLength;
  pcStack_28 = namebuff;
  namebuff_local._7_1_ = printNewline;
  pTStack_18 = threadContext;
  threadContext_local = (ThreadContext *)this;
  if (this->m_prefix != (TTDComparePath *)0x0) {
    WritePathToConsole(this->m_prefix,threadContext,false,namebuff,namebuffLength);
  }
  if (((this->m_stepKind == PropertyData) || (this->m_stepKind == PropertyGetter)) ||
     (this->m_stepKind == PropertySetter)) {
    local_38 = ThreadContext::GetPropertyName(pTStack_18,(PropertyId)(this->m_step).IndexOrPID);
    pcVar1 = pcStack_28;
    uVar3 = (ulong)pRecord._4_4_;
    src = Js::PropertyRecord::GetBuffer(local_38);
    cVar2 = Js::PropertyRecord::GetLength(local_38);
    js_memcpy_s(pcVar1,uVar3 << 1,src,(ulong)cVar2 << 1);
    pcVar1 = pcStack_28;
    uStack_3c = pRecord._4_4_ - 1;
    local_40 = Js::PropertyRecord::GetLength(local_38);
    puVar4 = min<unsigned_int>(&stack0xffffffffffffffc4,&local_40);
    pcVar1[*puVar4] = L'\0';
  }
  bVar6 = this->m_prefix == (TTDComparePath *)0x0;
  switch(this->m_stepKind) {
  case Empty:
    break;
  case Root:
    Output::Print(L"root#%I64i",(this->m_step).IndexOrPID);
    break;
  case PropertyData:
    pcVar5 = L".";
    if (bVar6) {
      pcVar5 = L"";
    }
    Output::Print(L"%ls%ls",pcVar5,pcStack_28);
    break;
  case PropertyGetter:
    pcVar5 = L".";
    if (bVar6) {
      pcVar5 = L"";
    }
    Output::Print(L"%ls<%ls",pcVar5,pcStack_28);
    break;
  case PropertySetter:
    pcVar5 = L".";
    if (bVar6) {
      pcVar5 = L"";
    }
    Output::Print(L"%ls>%ls",pcVar5,pcStack_28);
    break;
  case Array:
    Output::Print(L"[%I64i]",(this->m_step).IndexOrPID);
    break;
  case Scope:
    pcVar5 = L".";
    if (bVar6) {
      pcVar5 = L"";
    }
    Output::Print(L"%ls_scope[%I64i]",pcVar5,(this->m_step).IndexOrPID);
    break;
  case SlotArray:
    pcVar5 = L".";
    if (bVar6) {
      pcVar5 = L"";
    }
    Output::Print(L"%ls_slots[%I64i]",pcVar5,(this->m_step).IndexOrPID);
    break;
  case FunctionBody:
    pcVar5 = L".";
    if (bVar6) {
      pcVar5 = L"";
    }
    Output::Print(L"%ls%ls",pcVar5,(this->m_step).OptName);
    break;
  case Special:
    pcVar5 = L".";
    if (bVar6) {
      pcVar5 = L"";
    }
    Output::Print(L"%ls_%ls",pcVar5,(this->m_step).OptName);
    break;
  case SpecialArray:
    pcVar5 = L".";
    if (bVar6) {
      pcVar5 = L"";
    }
    Output::Print(L"%ls_%ls[%I64i]",pcVar5,(this->m_step).OptName,(this->m_step).IndexOrPID);
    break;
  default:
    TTDAbort_unrecoverable_error("Unknown tag in switch statement!!!");
  }
  if ((namebuff_local._7_1_ & 1) != 0) {
    Output::Print(L"\n");
  }
  return;
}

Assistant:

void TTDComparePath::WritePathToConsole(ThreadContext* threadContext, bool printNewline, _Out_writes_z_(namebuffLength) char16* namebuff, charcount_t namebuffLength) const
    {
        if(this->m_prefix != nullptr)
        {
            this->m_prefix->WritePathToConsole(threadContext, false, namebuff, namebuffLength);
        }

        if(this->m_stepKind == StepKind::PropertyData || this->m_stepKind == StepKind::PropertyGetter || this->m_stepKind == StepKind::PropertySetter)
        {
            const Js::PropertyRecord* pRecord = threadContext->GetPropertyName((Js::PropertyId)this->m_step.IndexOrPID);
            js_memcpy_s(namebuff, namebuffLength * sizeof(char16), pRecord->GetBuffer(), pRecord->GetLength() * sizeof(char16));

            // Don't allow the null to be written past the end of the buffer.
            namebuff[min(namebuffLength - 1, pRecord->GetLength())] = _u('\0');
        }

        bool isFirst = (this->m_prefix == nullptr);
        switch(this->m_stepKind)
        {
        case StepKind::Empty:
            break;
        case StepKind::Root:
            Output::Print(_u("root#%I64i"), this->m_step.IndexOrPID);
            break;
        case StepKind::PropertyData:
            Output::Print(_u("%ls%ls"), (isFirst ? _u("") : _u(".")), namebuff);
            break;
        case StepKind::PropertyGetter:
            Output::Print(_u("%ls<%ls"), (isFirst ? _u("") : _u(".")), namebuff);
            break;
        case StepKind::PropertySetter:
            Output::Print(_u("%ls>%ls"), (isFirst ? _u("") : _u(".")), namebuff);
            break;
        case StepKind::Array:
            Output::Print(_u("[%I64i]"), this->m_step.IndexOrPID);
            break;
        case StepKind::Scope:
            Output::Print(_u("%ls_scope[%I64i]"), (isFirst ? _u("") : _u(".")), this->m_step.IndexOrPID);
            break;
        case StepKind::SlotArray:
            Output::Print(_u("%ls_slots[%I64i]"), (isFirst ? _u("") : _u(".")), this->m_step.IndexOrPID);
            break;
        case StepKind::FunctionBody:
            Output::Print(_u("%ls%ls"), (isFirst ? _u("") : _u(".")), this->m_step.OptName);
            break;
        case StepKind::Special:
            Output::Print(_u("%ls_%ls"), (isFirst ? _u("") : _u(".")), this->m_step.OptName);
            break;
        case StepKind::SpecialArray:
            Output::Print(_u("%ls_%ls[%I64i]"), (isFirst ? _u("") : _u(".")), this->m_step.OptName, this->m_step.IndexOrPID);
            break;
        default:
            TTDAssert(false, "Unknown tag in switch statement!!!");
            break;
        }

        if(printNewline)
        {
            Output::Print(_u("\n"));
        }
    }